

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_compact_optional.cpp
# Opt level: O2

void test_evp_value_init(void)

{
  size_type *psVar1;
  bool bVar2;
  reference_type piVar3;
  reference_type __lhs;
  undefined1 *local_a0;
  undefined8 local_98;
  undefined1 local_90 [9];
  undefined4 local_87;
  undefined2 local_83;
  char local_81;
  undefined1 local_80 [8];
  opt_t o1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  undefined1 local_60 [8];
  opt_t_conflict oE;
  opt_t_conflict o1_1;
  
  local_80._0_4_ = 1;
  piVar3 = ak_toolbox::compact_optional_ns::detail_::
           compact_optional_base<ak_toolbox::compact_optional_ns::evp_value_init<int>_>::value
                     ((compact_optional_base<ak_toolbox::compact_optional_ns::evp_value_init<int>_>
                       *)local_80);
  if (*piVar3 != 1) {
    __assert_fail("o1.value() == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]compact_optional/test_compact_optional.cpp"
                  ,0x9d,"void test_evp_value_init()");
  }
  if (local_80._0_4_ != 1) {
    __assert_fail("o1.unsafe_raw_value() == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]compact_optional/test_compact_optional.cpp"
                  ,0xa0,"void test_evp_value_init()");
  }
  local_80 = (undefined1  [8])&local_70;
  _o1 = 0;
  local_70._M_local_buf[0] = '\0';
  std::__cxx11::string::string((string *)local_60,"one",(allocator *)&local_a0);
  o1_1.
  super_compact_optional_base<ak_toolbox::compact_optional_ns::evp_value_init<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .super_type.value_._M_dataplus =
       oE.
       super_compact_optional_base<ak_toolbox::compact_optional_ns::evp_value_init<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .super_type.value_._M_dataplus;
  oE.
  super_compact_optional_base<ak_toolbox::compact_optional_ns::evp_value_init<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .super_type.value_.field_2._8_8_ =
       &o1_1.
        super_compact_optional_base<ak_toolbox::compact_optional_ns::evp_value_init<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .super_type.value_._M_string_length;
  psVar1 = &oE.
            super_compact_optional_base<ak_toolbox::compact_optional_ns::evp_value_init<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .super_type.value_._M_string_length;
  if (local_60 != (undefined1  [8])psVar1) {
    oE.
    super_compact_optional_base<ak_toolbox::compact_optional_ns::evp_value_init<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .super_type.value_.field_2._8_8_ = local_60;
  }
  oE.
  super_compact_optional_base<ak_toolbox::compact_optional_ns::evp_value_init<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .super_type.value_._M_dataplus._M_p = (pointer)0x0;
  oE.
  super_compact_optional_base<ak_toolbox::compact_optional_ns::evp_value_init<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .super_type.value_._M_string_length._0_1_ = 0;
  local_60 = (undefined1  [8])psVar1;
  std::__cxx11::string::~string((string *)local_60);
  local_a0 = local_90;
  oE.
  super_compact_optional_base<ak_toolbox::compact_optional_ns::evp_value_init<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .super_type.value_._M_string_length._0_1_ = 0;
  oE.
  super_compact_optional_base<ak_toolbox::compact_optional_ns::evp_value_init<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .super_type.value_._M_string_length._1_7_ = (undefined7)local_90._1_8_;
  oE.
  super_compact_optional_base<ak_toolbox::compact_optional_ns::evp_value_init<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .super_type.value_.field_2._M_local_buf[0] = SUB81(local_90._1_8_,7);
  oE.
  super_compact_optional_base<ak_toolbox::compact_optional_ns::evp_value_init<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .super_type.value_.field_2._M_allocated_capacity._1_4_ = local_87;
  oE.
  super_compact_optional_base<ak_toolbox::compact_optional_ns::evp_value_init<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .super_type.value_.field_2._M_allocated_capacity._5_2_ = local_83;
  oE.
  super_compact_optional_base<ak_toolbox::compact_optional_ns::evp_value_init<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .super_type.value_.field_2._M_local_buf[7] = local_81;
  oE.
  super_compact_optional_base<ak_toolbox::compact_optional_ns::evp_value_init<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .super_type.value_._M_dataplus._M_p = (pointer)0x0;
  local_98 = 0;
  local_90[0] = 0;
  local_60 = (undefined1  [8])psVar1;
  std::__cxx11::string::~string((string *)&local_a0);
  bVar2 = ak_toolbox::compact_optional_ns::detail_::
          compact_optional_base<ak_toolbox::compact_optional_ns::evp_value_init<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::has_value((compact_optional_base<ak_toolbox::compact_optional_ns::evp_value_init<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_80);
  if (bVar2) {
    __assert_fail("!o_.has_value()",
                  "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]compact_optional/test_compact_optional.cpp"
                  ,0xa7,"void test_evp_value_init()");
  }
  bVar2 = ak_toolbox::compact_optional_ns::detail_::
          compact_optional_base<ak_toolbox::compact_optional_ns::evp_value_init<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::has_value((compact_optional_base<ak_toolbox::compact_optional_ns::evp_value_init<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)((long)&oE.
                                 super_compact_optional_base<ak_toolbox::compact_optional_ns::evp_value_init<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 .super_type.value_.field_2 + 8));
  if (!bVar2) {
    __assert_fail("o1.has_value()",
                  "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]compact_optional/test_compact_optional.cpp"
                  ,0xa8,"void test_evp_value_init()");
  }
  bVar2 = ak_toolbox::compact_optional_ns::detail_::
          compact_optional_base<ak_toolbox::compact_optional_ns::evp_value_init<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::has_value((compact_optional_base<ak_toolbox::compact_optional_ns::evp_value_init<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_60);
  if (bVar2) {
    __assert_fail("!oE.has_value()",
                  "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]compact_optional/test_compact_optional.cpp"
                  ,0xa9,"void test_evp_value_init()");
  }
  __lhs = ak_toolbox::compact_optional_ns::detail_::
          compact_optional_base<ak_toolbox::compact_optional_ns::evp_value_init<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::value((compact_optional_base<ak_toolbox::compact_optional_ns::evp_value_init<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)((long)&oE.
                             super_compact_optional_base<ak_toolbox::compact_optional_ns::evp_value_init<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .super_type.value_.field_2 + 8));
  bVar2 = std::operator==(__lhs,"one");
  if (!bVar2) {
    __assert_fail("o1.value() == \"one\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]compact_optional/test_compact_optional.cpp"
                  ,0xab,"void test_evp_value_init()");
  }
  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_80,"");
  if (!bVar2) {
    __assert_fail("o_.unsafe_raw_value() == \"\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]compact_optional/test_compact_optional.cpp"
                  ,0xad,"void test_evp_value_init()");
  }
  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          ((long)&oE.
                                  super_compact_optional_base<ak_toolbox::compact_optional_ns::evp_value_init<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  .super_type.value_.field_2 + 8),"one");
  if (!bVar2) {
    __assert_fail("o1.unsafe_raw_value() == \"one\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]compact_optional/test_compact_optional.cpp"
                  ,0xae,"void test_evp_value_init()");
  }
  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_60,"");
  if (!bVar2) {
    __assert_fail("oE.unsafe_raw_value() == \"\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]compact_optional/test_compact_optional.cpp"
                  ,0xaf,"void test_evp_value_init()");
  }
  std::__cxx11::string::~string((string *)local_60);
  std::__cxx11::string::~string
            ((string *)
             (oE.
              super_compact_optional_base<ak_toolbox::compact_optional_ns::evp_value_init<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .super_type.value_.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_80);
  return;
}

Assistant:

void test_evp_value_init()
{
  {
    typedef compact_optional<evp_value_init<int>> opt_t;
    opt_t o_, o1 (1), oE(0);
    
    assert (!o_.has_value());
    assert ( o1.has_value());
    assert (!oE.has_value());
    
    assert (o1.value() == 1);
    
    assert (o_.unsafe_raw_value() == 0);
    assert (o1.unsafe_raw_value() == 1);
    assert (oE.unsafe_raw_value() == 0);
  }
  {
    typedef compact_optional<evp_value_init<std::string>> opt_t;
    opt_t o_, o1 (std::string("one")), oE ((std::string()));
    
    assert (!o_.has_value());
    assert ( o1.has_value());
    assert (!oE.has_value());
    
    assert (o1.value() == "one");
    
    assert (o_.unsafe_raw_value() == "");
    assert (o1.unsafe_raw_value() == "one");
    assert (oE.unsafe_raw_value() == "");
  }
}